

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1;
  DisableForkStatementSyntax *pDVar1;
  DeepCloneVisitor visitor;
  Token local_68;
  NamedLabelSyntax *local_58;
  Token local_50;
  Token local_40;
  
  if (*(SyntaxNode **)(__fn + 0x18) == (SyntaxNode *)0x0) {
    local_58 = (NamedLabelSyntax *)0x0;
  }
  else {
    local_58 = (NamedLabelSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x18),(DeepCloneVisitor *)&local_68,
                          (BumpAllocator *)__child_stack);
  }
  args_1 = deepClone<slang::syntax::AttributeInstanceSyntax>
                     ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x20),
                      (BumpAllocator *)__child_stack);
  local_68 = parsing::Token::deepClone((Token *)(__fn + 0x58),(BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x68),(BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x78),(BumpAllocator *)__child_stack);
  pDVar1 = BumpAllocator::
           emplace<slang::syntax::DisableForkStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,&local_58,args_1,&local_68,&local_40,&local_50)
  ;
  return (int)pDVar1;
}

Assistant:

static SyntaxNode* clone(const DisableForkStatementSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<DisableForkStatementSyntax>(
        node.label ? deepClone(*node.label, alloc) : nullptr,
        *deepClone(node.attributes, alloc),
        node.disable.deepClone(alloc),
        node.fork.deepClone(alloc),
        node.semi.deepClone(alloc)
    );
}